

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.h
# Opt level: O0

void __thiscall Rand::reseed(Rand *this,uint32_t seed)

{
  uint in_ESI;
  Rand *in_RDI;
  int i;
  int local_10;
  
  in_RDI->x = in_ESI ^ 0x498b3bc5;
  in_RDI->y = 0;
  in_RDI->z = 0;
  in_RDI->w = 0;
  for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
    mix(in_RDI);
  }
  return;
}

Assistant:

void reseed ( uint32_t seed )
  {
    x = 0x498b3bc5 ^ seed;
    y = 0;
    z = 0;
    w = 0;

    for(int i = 0; i < 10; i++) mix();
  }